

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ebmlmain.c
# Opt level: O0

fourcc_t EBML_IdFromBuffer(uint8_t *PossibleId,int8_t IdLength)

{
  int8_t IdLength_local;
  uint8_t *PossibleId_local;
  
  if (IdLength == '\x01') {
    PossibleId_local._4_4_ = (uint)*PossibleId;
  }
  else if (IdLength == '\x02') {
    PossibleId_local._4_4_ = (uint)CONCAT11(*PossibleId,PossibleId[1]);
  }
  else if (IdLength == '\x03') {
    PossibleId_local._4_4_ =
         (uint)*PossibleId << 0x10 | (uint)PossibleId[1] << 8 | (uint)PossibleId[2];
  }
  else {
    PossibleId_local._4_4_ =
         (uint)*PossibleId << 0x18 | (uint)PossibleId[1] << 0x10 | (uint)PossibleId[2] << 8 |
         (uint)PossibleId[3];
  }
  return PossibleId_local._4_4_;
}

Assistant:

static fourcc_t EBML_IdFromBuffer(const uint8_t *PossibleId, int8_t IdLength)
{
    if (IdLength == 1)
        return FOURCCBE(0,0,0,PossibleId[0]);
    if (IdLength == 2)
        return FOURCCBE(0,0,PossibleId[0],PossibleId[1]);
    if (IdLength == 3)
        return FOURCCBE(0,PossibleId[0],PossibleId[1],PossibleId[2]);
    return FOURCCBE(PossibleId[0],PossibleId[1],PossibleId[2],PossibleId[3]);
}